

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

void set_mimic_sym(monst *mtmp,level *lev)

{
  char cVar1;
  int iVar2;
  int y;
  int iVar3;
  int iVar4;
  obj *obj;
  int my;
  int mx;
  obj *otmp;
  int s_sym;
  uint ap_type;
  uint appear;
  int rt;
  int roomno;
  int typ;
  level *lev_local;
  monst *mtmp_local;
  
  if (mtmp == (monst *)0x0) {
    return;
  }
  iVar2 = (int)mtmp->mx;
  y = (int)mtmp->my;
  cVar1 = lev->locations[iVar2][y].typ;
  iVar3 = (*(uint *)&lev->locations[iVar2][y].field_0x6 >> 0x10 & 0x3f) - 3;
  if (iVar3 < 0) {
    ap_type = 0;
  }
  else {
    ap_type = (uint)lev->rooms[iVar3].rtype;
  }
  if (lev->objects[iVar2][y] == (obj *)0x0) {
    if (((cVar1 == '\x17') || (((cVar1 != '\0' && (cVar1 < '\r')) || (cVar1 == '\x0f')))) ||
       (cVar1 == '\x10')) {
      otmp._4_1_ = '\x01';
      if ((iVar2 == 0) ||
         (((((lev->locations[iVar2 + -1][y].typ != '\x02' &&
             (lev->locations[iVar2 + -1][y].typ != '\x03')) &&
            ((lev->locations[iVar2 + -1][y].typ != '\v' &&
             ((lev->locations[iVar2 + -1][y].typ != '\x05' &&
              (lev->locations[iVar2 + -1][y].typ != '\t')))))) &&
           (lev->locations[iVar2 + -1][y].typ != '\a')) &&
          (lev->locations[iVar2 + -1][y].typ != '\b')))) {
        s_sym = 0x1b;
      }
      else {
        s_sym = 0x1c;
      }
      if (((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
          (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
        block_point(iVar2,y);
      }
    }
    else if (((*(uint *)&(lev->flags).field_0x8 >> 0x11 & 1) == 0) || (iVar4 = rn2(2), iVar4 == 0))
    {
      if (iVar3 < 0) {
        otmp._4_1_ = '\x02';
        s_sym = 0x214;
        if (((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
          block_point(iVar2,y);
        }
      }
      else if ((ap_type == 8) || (ap_type == 4)) {
        otmp._4_1_ = '\x02';
        s_sym = 0x1ef;
      }
      else if (ap_type == 9) {
        iVar2 = rn2(2);
        if (iVar2 == 0) {
          otmp._4_1_ = '\x01';
          s_sym = 0x2b;
        }
        else {
          otmp._4_1_ = '\x02';
          s_sym = 0x215;
        }
      }
      else if (ap_type == 10) {
        otmp._4_1_ = '\x01';
        s_sym = 0x26;
      }
      else {
        if ((int)ap_type < 0x12) {
          iVar2 = rn2(0x12);
          otmp._0_4_ = (int)"\x12\x13\x04\v\x02\a\f\t\b\x03\x05\x06\x0e\r\n<<<"[iVar2];
        }
        else {
          otmp._0_4_ = get_shop_item(ap_type - 0x12);
          if ((int)otmp < 0) {
            otmp._4_1_ = '\x02';
            s_sym = -(int)otmp;
            goto LAB_0020970e;
          }
          if ((int)otmp == 0) {
            iVar2 = rn2(0x10);
            otmp._0_4_ = (int)"\x12\x13\x04\v\x02\a\f\t\b\x03\x05\x06\x0e\r\n<<<"[iVar2 + 2];
          }
        }
        if ((int)otmp < 0x12) {
          if ((int)otmp == 0xc) {
            s_sym = 0x1ef;
          }
          else if ((int)otmp == 0x3c) {
            s_sym = 0;
          }
          else {
            obj = mkobj(lev,(char)(int)otmp,'\0');
            s_sym = (int)obj->otyp;
            obfree(obj,(obj *)0x0);
          }
          otmp._4_1_ = '\x02';
        }
        else {
          otmp._4_1_ = '\x01';
          s_sym = 0x21;
          if ((int)otmp == 0x12) {
            s_sym = 0x20;
          }
        }
      }
    }
    else {
      otmp._4_1_ = '\x02';
      s_sym = 0x215;
    }
  }
  else {
    otmp._4_1_ = '\x02';
    s_sym = (int)lev->objects[iVar2][y]->otyp;
  }
LAB_0020970e:
  mtmp->m_ap_type = otmp._4_1_;
  mtmp->mappearance = s_sym;
  return;
}

Assistant:

void set_mimic_sym(struct monst *mtmp, struct level *lev)
{
	int typ, roomno, rt;
	unsigned appear, ap_type;
	int s_sym;
	struct obj *otmp;
	int mx, my;

	if (!mtmp) return;
	mx = mtmp->mx; my = mtmp->my;
	typ = lev->locations[mx][my].typ;
					/* only valid for INSIDE of room */
	roomno = lev->locations[mx][my].roomno - ROOMOFFSET;
	if (roomno >= 0)
		rt = lev->rooms[roomno].rtype;
	else	rt = 0;	/* roomno < 0 case */

	if (OBJ_AT_LEV(lev, mx, my)) {
		ap_type = M_AP_OBJECT;
		appear = lev->objects[mx][my]->otyp;
	} else if (IS_DOOR(typ) || IS_WALL(typ) ||
		   typ == SDOOR || typ == SCORR) {
		ap_type = M_AP_FURNITURE;
		/*
		 *  If there is a wall to the left that connects to this
		 *  location, then the mimic mimics a horizontal closed door.
		 *  This does not allow doors to be in corners of rooms.
		 */
		if (mx != 0 &&
			(lev->locations[mx-1][my].typ == HWALL    ||
			 lev->locations[mx-1][my].typ == TLCORNER ||
			 lev->locations[mx-1][my].typ == TRWALL   ||
			 lev->locations[mx-1][my].typ == BLCORNER ||
			 lev->locations[mx-1][my].typ == TDWALL   ||
			 lev->locations[mx-1][my].typ == CROSSWALL||
			 lev->locations[mx-1][my].typ == TUWALL    ))
		    appear = S_hcdoor;
		else
		    appear = S_vcdoor;

		if (!mtmp->minvis || See_invisible)
		    block_point(mx,my);	/* vision */
	} else if (lev->flags.is_maze_lev && rn2(2)) {
		ap_type = M_AP_OBJECT;
		appear = STATUE;
	} else if (roomno < 0) {
		ap_type = M_AP_OBJECT;
		appear = BOULDER;
		if (!mtmp->minvis || See_invisible)
		    block_point(mx,my);	/* vision */
	} else if (rt == ZOO || rt == VAULT) {
		ap_type = M_AP_OBJECT;
		appear = GOLD_PIECE;
	} else if (rt == DELPHI) {
		if (rn2(2)) {
			ap_type = M_AP_OBJECT;
			appear = STATUE;
		} else {
			ap_type = M_AP_FURNITURE;
			appear = S_fountain;
		}
	} else if (rt == TEMPLE) {
		ap_type = M_AP_FURNITURE;
		appear = S_altar;
	/*
	 * We won't bother with beehives, morgues, barracks, throne rooms
	 * since they shouldn't contain too many mimics anyway...
	 */
	} else if (rt >= SHOPBASE) {
		s_sym = get_shop_item(rt - SHOPBASE);
		if (s_sym < 0) {
			ap_type = M_AP_OBJECT;
			appear = -s_sym;
		} else {
			if (s_sym == RANDOM_CLASS)
				s_sym = syms[rn2((int)sizeof(syms)-2) + 2];
			goto assign_sym;
		}
	} else {
		s_sym = syms[rn2((int)sizeof(syms))];
assign_sym:
		if (s_sym >= MAXOCLASSES) {
			ap_type = M_AP_FURNITURE;
			appear = s_sym == MAXOCLASSES ? S_upstair : S_dnstair;
		} else if (s_sym == COIN_CLASS) {
			ap_type = M_AP_OBJECT;
			appear = GOLD_PIECE;
		} else {
			ap_type = M_AP_OBJECT;
			if (s_sym == S_MIMIC_DEF) {
				appear = STRANGE_OBJECT;
			} else {
				otmp = mkobj(lev,  (char) s_sym, FALSE );
				appear = otmp->otyp;
				/* make sure container contents are free'ed */
				obfree(otmp, NULL);
			}
		}
	}
	mtmp->m_ap_type = ap_type;
	mtmp->mappearance = appear;
}